

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

error_code __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::assign
          (reactive_socket_service<asio::ip::tcp> *this,implementation_type *impl,
          protocol_type *protocol,native_handle_type *native_socket,error_code *ec)

{
  bool bVar1;
  int type;
  error_code eVar2;
  error_code local_50;
  error_code *local_40;
  error_code *ec_local;
  native_handle_type *native_socket_local;
  protocol_type *protocol_local;
  implementation_type *impl_local;
  reactive_socket_service<asio::ip::tcp> *this_local;
  
  local_40 = ec;
  ec_local = (error_code *)native_socket;
  native_socket_local = &protocol->family_;
  protocol_local = (protocol_type *)impl;
  impl_local = (implementation_type *)this;
  type = ip::tcp::type(protocol);
  eVar2 = reactive_socket_service_base::do_assign
                    (&this->super_reactive_socket_service_base,&impl->super_base_implementation_type
                     ,type,&ec_local->_M_value,local_40);
  local_50._M_cat = eVar2._M_cat;
  local_50._M_value = eVar2._M_value;
  bVar1 = std::error_code::operator_cast_to_bool(&local_50);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    protocol_local[4].family_ = *native_socket_local;
  }
  eVar2._0_8_ = *(ulong *)local_40 & 0xffffffff;
  eVar2._M_cat = local_40->_M_cat;
  return eVar2;
}

Assistant:

asio::error_code assign(implementation_type& impl,
      const protocol_type& protocol, const native_handle_type& native_socket,
      asio::error_code& ec)
  {
    if (!do_assign(impl, protocol.type(), native_socket, ec))
      impl.protocol_ = protocol;
    return ec;
  }